

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O2

ulint __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,symbol x,
          ulint i)

{
  reference __x;
  vector<bool,_std::allocator<bool>_> code;
  _Bvector_base<std::allocator<bool>_> local_40;
  
  if (this->n == 0) {
    i = 0;
  }
  else if (this->unary_string == false) {
    __x = std::
          vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          ::at(&this->codes,(ulong)x);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_40,__x);
    i = rank(this,(vector<bool,_std::allocator<bool>_> *)&local_40,0,0,i);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_40);
  }
  return i;
}

Assistant:

ulint rank(symbol x, ulint i){

		if(n==0)
			return 0;

	#ifdef DEBUG
		if(i>current_size){

			cout << "ERROR (DynamicString): trying to compute rank in position outside current string : " << i << ">" << current_size << endl;
			exit(0);

		}
	#endif

		if(unary_string)
			return i;

		vector<bool> code = codes.at(x);//bitvector to be searched in the wavelet tree
		return rank(&code, 0, 0, i);

	}